

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

size_t DiagnosticInfo_calcSizeBinary(UA_DiagnosticInfo *src,UA_DataType *_)

{
  size_t sVar1;
  size_t local_20;
  size_t s;
  UA_DataType *__local;
  UA_DiagnosticInfo *src_local;
  
  local_20 = 1;
  if ((undefined1  [56])((undefined1  [56])*src & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
    local_20 = 5;
  }
  if ((*(byte *)src >> 1 & 1) != 0) {
    local_20 = local_20 + 4;
  }
  if ((*(byte *)src >> 2 & 1) != 0) {
    local_20 = local_20 + 4;
  }
  if ((*(byte *)src >> 3 & 1) != 0) {
    local_20 = local_20 + 4;
  }
  if ((*(byte *)src >> 4 & 1) != 0) {
    sVar1 = String_calcSizeBinary(&src->additionalInfo,(UA_DataType *)0x0);
    local_20 = sVar1 + local_20;
  }
  if ((*(byte *)src >> 5 & 1) != 0) {
    local_20 = local_20 + 4;
  }
  if ((*(byte *)src >> 6 & 1) != 0) {
    sVar1 = DiagnosticInfo_calcSizeBinary(src->innerDiagnosticInfo,(UA_DataType *)0x0);
    local_20 = sVar1 + local_20;
  }
  return local_20;
}

Assistant:

static size_t
DiagnosticInfo_calcSizeBinary(const UA_DiagnosticInfo *src, UA_DataType *_) {
    size_t s = 1; // encoding byte
    if(src->hasSymbolicId)
        s += 4;
    if(src->hasNamespaceUri)
        s += 4;
    if(src->hasLocalizedText)
        s += 4;
    if(src->hasLocale)
        s += 4;
    if(src->hasAdditionalInfo)
        s += String_calcSizeBinary(&src->additionalInfo, NULL);
    if(src->hasInnerStatusCode)
        s += 4;
    if(src->hasInnerDiagnosticInfo)
        s += DiagnosticInfo_calcSizeBinary(src->innerDiagnosticInfo, NULL);
    return s;
}